

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O2

void __thiscall QLineEditPrivate::removeAction(QLineEditPrivate *this,QAction *action)

{
  QWidget *this_00;
  QWidget *widget;
  QObject *object;
  int iVar1;
  SideWidgetLocation SVar2;
  reference pvVar3;
  QWidgetAction *this_01;
  SideWidgetEntryList *this_02;
  long in_FS_OFFSET;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  SVar2 = findSideWidget(this,action);
  if (-1 < (long)SVar2) {
    this_02 = &this->leadingSideWidgets;
    if (SVar2.position == TrailingPosition) {
      this_02 = &this->trailingSideWidgets;
    }
    pvVar3 = std::
             vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
             ::operator[](this_02,(ulong)SVar2 >> 0x20);
    widget = pvVar3->widget;
    object = (QObject *)pvVar3->action;
    iVar1 = pvVar3->flags;
    std::
    vector<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>::
    erase(this_02,(this_02->
                  super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
                  )._M_impl.super__Vector_impl_data._M_start + ((ulong)SVar2 >> 0x20));
    if ((iVar1 & 2) == 0) {
      if (widget != (QWidget *)0x0) {
        (**(code **)(*(long *)widget + 0x20))(widget);
      }
    }
    else {
      this_01 = QtPrivate::qobject_cast_helper<QWidgetAction*,QObject>(object);
      if (this_01 != (QWidgetAction *)0x0) {
        QWidgetAction::releaseWidget(this_01,widget);
      }
    }
    positionSideWidgets(this);
    if (((this->leadingSideWidgets).
         super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
         ._M_impl.super__Vector_impl_data._M_start ==
         (this->leadingSideWidgets).
         super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
         ._M_impl.super__Vector_impl_data._M_finish) &&
       ((this->trailingSideWidgets).
        super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->trailingSideWidgets).
        super__Vector_base<QLineEditPrivate::SideWidgetEntry,_std::allocator<QLineEditPrivate::SideWidgetEntry>_>
        ._M_impl.super__Vector_impl_data._M_finish)) {
      QObjectPrivate::
      connect<void(QLineEdit::*)(QString_const&),void(QLineEditPrivate::*)(QString_const&)>
                ((Object *)&stack0xffffffffffffffc0,(offset_in_QLineEdit_to_subr)this_00,
                 (Object *)QLineEdit::textChanged,0,(ConnectionType)this);
      QMetaObject::Connection::~Connection((Connection *)&stack0xffffffffffffffc0);
    }
    QWidget::update(this_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEditPrivate::removeAction(QAction *action)
{
    Q_Q(QLineEdit);
    const auto location = findSideWidget(action);
    if (!location.isValid())
        return;
    SideWidgetEntryList &list = location.position == QLineEdit::TrailingPosition ? trailingSideWidgets : leadingSideWidgets;
    SideWidgetEntry entry = list[location.index];
    list.erase(list.begin() + location.index);
    if (entry.flags & SideWidgetCreatedByWidgetAction) {
        // If the cast fails, the QAction is in the process of being deleted
        // and has already ceased to be a QWidgetAction; in the process, it
        // will release its widget itself, and calling releaseWidget() here
        // would be UB, so don't:
        if (const auto a = qobject_cast<QWidgetAction*>(entry.action))
            a->releaseWidget(entry.widget);
    } else {
         delete entry.widget;
    }
     positionSideWidgets();
     if (!hasSideWidgets()) // Last widget, remove connection
         QObjectPrivate::connect(q, &QLineEdit::textChanged,
                                 this, &QLineEditPrivate::textChanged);
     q->update();
}